

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# impl_canbus.cc
# Opt level: O0

string * __thiscall ccel::canbus::canbus_handler::interface_name_abi_cxx11_(canbus_handler *this)

{
  long in_RSI;
  string *in_RDI;
  
  std::__cxx11::string::string(in_RDI,(string *)(in_RSI + 0x58));
  return in_RDI;
}

Assistant:

std::string canbus_handler::interface_name() { return _interface_name; }